

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O0

QString * __thiscall QSpinBox::textFromValue(QSpinBox *this,int value)

{
  int iVar1;
  QSpinBoxPrivate *pQVar2;
  int in_EDX;
  QString *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QSpinBoxPrivate *d;
  QString *str;
  QLocale loc;
  QLatin1StringView prefix;
  QWidget *this_00;
  QLocale local_78 [2];
  undefined1 auStack_68 [72];
  QLatin1StringView local_20;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  local_c = in_EDX;
  pQVar2 = d_func((QSpinBox *)0x6913a8);
  *(undefined1 **)this_00 = &DAT_aaaaaaaaaaaaaaaa;
  (((QString *)&this_00->field_0x8)->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&this_00->super_QPaintDevice = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x6913dc);
  if (*(int *)&(pQVar2->super_QAbstractSpinBoxPrivate).field_0x3d4 == 10) {
    local_78[0] = (QLocale)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::locale(this_00);
    if ((*(ushort *)&(pQVar2->super_QAbstractSpinBoxPrivate).field_0x3d0 >> 9 & 1) == 0) {
      QLocale::numberOptions();
      QFlags<QLocale::NumberOption>::operator|
                ((QFlags<QLocale::NumberOption> *)in_RSI,(NumberOption)((ulong)in_RDI >> 0x20));
      QLocale::setNumberOptions((QFlags_conflict1 *)local_78);
    }
    else {
      QLocale::numberOptions();
      QFlags<QLocale::NumberOption>::operator&
                ((QFlags<QLocale::NumberOption> *)in_RSI,(int)((ulong)in_RDI >> 0x20));
      QLocale::setNumberOptions((QFlags_conflict1 *)local_78);
    }
    QLocale::toString((QLocale *)this_00,(int)((ulong)in_RSI >> 0x20));
    QString::operator=(in_RSI,(QString *)in_RDI);
    QString::~QString((QString *)0x6915ad);
    QLocale::~QLocale(local_78);
  }
  else {
    local_20.m_data = &DAT_aaaaaaaaaaaaaaaa;
    local_20.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    if (local_c < 0) {
      local_20 = Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)in_RSI);
    }
    else {
      local_20 = Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)in_RSI);
    }
    iVar1 = qAbs<int>(&local_c);
    QString::number((int)auStack_68 + -8,iVar1);
    ::operator+((QLatin1String *)this_00,in_RSI);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<const_QLatin1String_&,_QString> *)in_RDI);
    QString::operator=(in_RSI,(QString *)in_RDI);
    QString::~QString((QString *)0x6914cb);
    QStringBuilder<const_QLatin1String_&,_QString>::~QStringBuilder
              ((QStringBuilder<const_QLatin1String_&,_QString> *)0x6914d8);
    QString::~QString((QString *)0x6914e2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

QString QSpinBox::textFromValue(int value) const
{
    Q_D(const QSpinBox);
    QString str;

    if (d->displayIntegerBase != 10) {
        const auto prefix = value < 0 ? "-"_L1 : ""_L1;
        str = prefix + QString::number(qAbs(value), d->displayIntegerBase);
    } else {
        QLocale loc = locale();
        if (d->showGroupSeparator)
            loc.setNumberOptions(loc.numberOptions() & ~QLocale::OmitGroupSeparator);
        else
            loc.setNumberOptions(loc.numberOptions() | QLocale::OmitGroupSeparator);
        str = loc.toString(value);
    }

    return str;
}